

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O0

void ihevc_inter_pred_luma_vert_w16inp_w16out
               (WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  WORD32 i4_tmp;
  WORD32 i;
  WORD32 col;
  WORD32 row;
  WORD32 ht_local;
  WORD8 *pi1_coeff_local;
  WORD32 dst_strd_local;
  WORD32 src_strd_local;
  WORD16 *pi2_dst_local;
  WORD16 *pi2_src_local;
  
  pi2_dst_local = pi2_dst;
  pi2_src_local = pi2_src;
  for (row = 0; row < ht; row = row + 1) {
    for (col = 0; col < wd; col = col + 1) {
      i4_tmp = 0;
      for (i = 0; i < 8; i = i + 1) {
        i4_tmp = (int)pi1_coeff[i] * (int)pi2_src_local[col + (i + -3) * src_strd] + i4_tmp;
      }
      pi2_dst_local[col] = (short)(i4_tmp >> 6) + -0x2000;
    }
    pi2_src_local = pi2_src_local + src_strd;
    pi2_dst_local = pi2_dst_local + dst_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16inp_w16out(WORD16 *pi2_src,
                                              WORD16 *pi2_dst,
                                              WORD32 src_strd,
                                              WORD32 dst_strd,
                                              WORD8 *pi1_coeff,
                                              WORD32 ht,
                                              WORD32 wd)
{
    WORD32 row, col, i;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i4_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i4_tmp += pi1_coeff[i] * pi2_src[col + (i - 3) * src_strd];

            i4_tmp = (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) - OFFSET14;

            pi2_dst[col] = i4_tmp;
        }

        pi2_src += src_strd;
        pi2_dst += dst_strd;
    }

}